

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

bool __thiscall QDateTime::isDaylightTime(QDateTime *this)

{
  QDateTimePrivate *pQVar1;
  QTimeZonePrivate *pQVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar3;
  int iVar4;
  DaylightStatus DVar5;
  qint64 qVar6;
  uint uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  ZoneState ZStack_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d;
  uVar7 = (uint)pQVar1;
  if (((ulong)pQVar1 & 1) == 0) {
    uVar3 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    if ((uVar3 & 8) == 0) goto LAB_0030ec95;
LAB_0030ec7d:
    uVar3 = uVar3 >> 4 & 3;
    if (uVar3 == 0) {
      if (((ulong)pQVar1 & 1) == 0) {
        uVar7 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
      }
      DVar5 = DaylightTime;
      if (-1 < (char)uVar7) {
        DVar5 = (uint)((uVar7 >> 6 & 1) != 0) + UnknownDaylightTime;
      }
      if (DVar5 == UnknownDaylightTime) {
        if (((ulong)pQVar1 & 1) == 0) {
          qVar6 = pQVar1->m_msecs;
        }
        else {
          qVar6 = (long)pQVar1 >> 8;
        }
        QDateTimePrivate::localStateAtMillis(&ZStack_28,qVar6,(TransitionOptions)0x24);
        DVar5 = ZStack_28.dst;
      }
      bVar8 = DVar5 == DaylightTime;
    }
    else {
      if (uVar3 != 3) goto LAB_0030ec95;
      if (((ulong)pQVar1 & 1) == 0) {
        uVar7 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
      }
      iVar4 = 1;
      if (-1 < (char)uVar7) {
        iVar4 = ((uVar7 >> 6 & 1) != 0) - 1;
      }
      bVar8 = iVar4 == 1;
      if (iVar4 == -1) {
        pQVar2 = (pQVar1->m_timeZone).d.d;
        qVar6 = toMSecsSinceEpoch(this);
        UNRECOVERED_JUMPTABLE = pQVar2->_vptr_QTimeZonePrivate[0xc];
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          iVar4 = (*UNRECOVERED_JUMPTABLE)
                            (pQVar2,qVar6,*(long *)(in_FS_OFFSET + 0x28),UNRECOVERED_JUMPTABLE);
          return SUB41(iVar4,0);
        }
        goto LAB_0030ed4b;
      }
    }
  }
  else {
    uVar3 = uVar7;
    if (((ulong)pQVar1 & 8) != 0) goto LAB_0030ec7d;
LAB_0030ec95:
    bVar8 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar8;
  }
LAB_0030ed4b:
  __stack_chk_fail();
}

Assistant:

bool QDateTime::isDaylightTime() const
{
    if (!isValid())
        return false;

    switch (getSpec(d)) {
    case Qt::UTC:
    case Qt::OffsetFromUTC:
        return false;
    case Qt::TimeZone:
#if !QT_CONFIG(timezone)
        break;
#else
        Q_ASSERT(d->m_timeZone.isValid());
        if (auto dst = extractDaylightStatus(getStatus(d));
            dst != QDateTimePrivate::UnknownDaylightTime) {
            return dst == QDateTimePrivate::DaylightTime;
        }
        return d->m_timeZone.d->isDaylightTime(toMSecsSinceEpoch());
#endif // timezone
    case Qt::LocalTime: {
        auto dst = extractDaylightStatus(getStatus(d));
        if (dst == QDateTimePrivate::UnknownDaylightTime) {
            dst = QDateTimePrivate::localStateAtMillis(
                getMSecs(d), toTransitionOptions(TransitionResolution::LegacyBehavior)).dst;
        }
        return dst == QDateTimePrivate::DaylightTime;
        }
    }
    return false;
}